

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O2

bool __thiscall
teetime::Image::loadFromMemory(Image *this,uint8 *data,size_t dataSize,char *filename)

{
  Rgba *pRVar1;
  int comp;
  int height;
  int width;
  
  reset(this);
  init_stb();
  width = 0;
  height = 0;
  comp = 0;
  if (0x7ffffffe < dataSize) {
    __assert_fail("dataSize < INT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/teetime-framework[P]TeeTime-Cpp-Examples/3rdParty/teetime/src/Image.cpp"
                  ,0xa6,"bool teetime::Image::loadFromMemory(const uint8 *, size_t, const char *)");
  }
  pRVar1 = (Rgba *)stbi_load_from_memory(data,(int)dataSize,&width,&height,&comp,4);
  if (pRVar1 != (Rgba *)0x0) {
    if ((long)width < 1) {
      __assert_fail("width > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/teetime-framework[P]TeeTime-Cpp-Examples/3rdParty/teetime/src/Image.cpp"
                    ,0xaa,"bool teetime::Image::loadFromMemory(const uint8 *, size_t, const char *)"
                   );
    }
    if ((long)height < 1) {
      __assert_fail("height > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/teetime-framework[P]TeeTime-Cpp-Examples/3rdParty/teetime/src/Image.cpp"
                    ,0xab,"bool teetime::Image::loadFromMemory(const uint8 *, size_t, const char *)"
                   );
    }
    if (comp < 1) {
      __assert_fail("comp > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/teetime-framework[P]TeeTime-Cpp-Examples/3rdParty/teetime/src/Image.cpp"
                    ,0xac,"bool teetime::Image::loadFromMemory(const uint8 *, size_t, const char *)"
                   );
    }
    this->m_data = pRVar1;
    this->m_width = (long)width;
    this->m_height = (long)height;
    std::__cxx11::string::assign((char *)&this->m_filename);
  }
  return pRVar1 != (Rgba *)0x0;
}

Assistant:

bool Image::loadFromMemory(const uint8* data, size_t dataSize, const char* filename)
{
  reset();

  init_stb();
  int width = 0;
  int height = 0;
  int comp = 0;

  assert(dataSize < INT_MAX);

  if (auto p = stbi_load_from_memory(data, static_cast<int>(dataSize), &width, &height, &comp, 4))
  {
    assert(width > 0);
    assert(height > 0);
    assert(comp > 0);

    m_data = (Image::Rgba*)p;
    m_width = width;
    m_height = height;
    m_filename = filename;

    return true;
  }

  return false;
}